

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Float32_To_Int24(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                     int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float *src;
  int iVar1;
  uchar *dest;
  undefined1 *puVar2;
  
  if (count != 0) {
    puVar2 = (undefined1 *)((long)destinationBuffer + 2);
    do {
      iVar1 = (int)(*sourceBuffer * 2.1474836e+09);
      puVar2[-2] = (char)((uint)iVar1 >> 8);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
      puVar2[-1] = (char)((uint)iVar1 >> 0x10);
      *puVar2 = (char)((uint)iVar1 >> 0x18);
      puVar2 = puVar2 + destinationStride * 3;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Float32_To_Int24(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    PaInt32 temp;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        /* convert to 32 bit and drop the low 8 bits */
        double scaled = (double)(*src) * 2147483647.0;
        temp = (PaInt32) scaled;

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = (unsigned char)(temp >> 8);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 24);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(temp >> 24);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 8);
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}